

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_conn.c
# Opt level: O3

csp_conn_t * csp_conn_allocate(csp_conn_type_t type)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  
  uVar2 = (ulong)csp_conn_allocate::csp_conn_last_given;
  iVar3 = 8;
  while( true ) {
    uVar1 = (int)uVar2 + 1U & 7;
    uVar2 = (ulong)uVar1;
    LOCK();
    bVar4 = arr_conn[uVar2].state == 0;
    if (bVar4) {
      arr_conn[uVar2].state = 1;
    }
    UNLOCK();
    if (bVar4) break;
    iVar3 = iVar3 + -1;
    if (iVar3 == 0) {
      csp_dbg_conn_out = csp_dbg_conn_out + '\x01';
      return (csp_conn_t *)0x0;
    }
  }
  csp_conn_allocate::csp_conn_last_given = (uint8_t)uVar1;
  arr_conn[uVar2].timestamp = 0;
  LOCK();
  arr_conn[uVar2].type = type;
  UNLOCK();
  arr_conn[uVar2].idin.flags = '\0';
  arr_conn[uVar2].idout.flags = '\0';
  return arr_conn + uVar2;
}

Assistant:

csp_conn_t * csp_conn_allocate(csp_conn_type_t type) {

	static uint8_t csp_conn_last_given = 0;

	/* Search for free connection */
	csp_conn_t * conn = NULL;
	int i = csp_conn_last_given;
	for (int j = 0; j < CSP_CONN_MAX; j++) {
		i = (i + 1) % CSP_CONN_MAX;

		int expected = CONN_CLOSED;
		if (atomic_compare_exchange_strong(&arr_conn[i].state, &expected, CONN_OPEN)) {
			conn = &arr_conn[i];
			csp_conn_last_given = i;
			break;
		}
	}

	if (conn == NULL) {
		csp_dbg_conn_out++;
		return NULL;
	}

	conn->timestamp = 0;
	conn->type = type;
	conn->idin.flags = 0;
	conn->idout.flags = 0;
	return conn;
}